

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish.cpp
# Opt level: O1

int __thiscall ncnn::HardSwish::forward_inplace(HardSwish *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar6 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    lVar7 = 0;
    do {
      if (0 < (int)uVar5) {
        uVar8 = 0;
        do {
          fVar1 = *(float *)((long)pvVar6 + uVar8 * 4);
          fVar9 = 0.0;
          if (fVar1 < this->lower) {
LAB_004ceb4b:
            *(float *)((long)pvVar6 + uVar8 * 4) = fVar9;
          }
          else if (fVar1 < this->upper || fVar1 == this->upper) {
            fVar9 = (this->alpha * fVar1 + this->beta) * fVar1;
            goto LAB_004ceb4b;
          }
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      lVar7 = lVar7 + 1;
      pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
    } while (lVar7 != iVar2);
  }
  return 0;
}

Assistant:

int HardSwish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < lower)
                ptr[i] = 0.f;
            else if (ptr[i] > upper)
                ;
            else
                ptr[i] = ptr[i] * (ptr[i] * alpha + beta);
        }
    }

    return 0;
}